

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context-decls.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDeclsCtx::addTable
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *this,Name name,
          vector<wasm::Name,_std::allocator<wasm::Name>_> *exports,ImportNames *import,
          TableType type,Index pos)

{
  Module *wasm;
  Err *pEVar1;
  Table **ppTVar2;
  size_type sVar3;
  bool bVar4;
  Ok local_1c9;
  value_type local_1c8;
  Err local_198;
  Err *local_178;
  Err *err_2;
  Result<wasm::Ok> _val_2;
  Err *err_1;
  Result<wasm::Table_*> _val_1;
  undefined1 local_c8 [8];
  Result<wasm::Table_*> t;
  Err local_98;
  Err *local_68;
  Err *err;
  Result<wasm::Ok> _val;
  ImportNames *import_local;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *exports_local;
  ParseDeclsCtx *this_local;
  Name name_local;
  
  _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _32_8_ = import;
  checkImport((Result<wasm::Ok> *)&err,this,pos,import);
  local_68 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
  t.val.super__Variant_base<wasm::Table_*,_wasm::Err>.
  super__Move_assign_alias<wasm::Table_*,_wasm::Err>.
  super__Copy_assign_alias<wasm::Table_*,_wasm::Err>.
  super__Move_ctor_alias<wasm::Table_*,_wasm::Err>.super__Copy_ctor_alias<wasm::Table_*,_wasm::Err>.
  super__Variant_storage_alias<wasm::Table_*,_wasm::Err>._36_1_ = local_68 != (Err *)0x0;
  if ((bool)t.val.super__Variant_base<wasm::Table_*,_wasm::Err>.
            super__Move_assign_alias<wasm::Table_*,_wasm::Err>.
            super__Copy_assign_alias<wasm::Table_*,_wasm::Err>.
            super__Move_ctor_alias<wasm::Table_*,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Table_*,_wasm::Err>.
            super__Variant_storage_alias<wasm::Table_*,_wasm::Err>._36_1_) {
    wasm::Err::Err(&local_98,local_68);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_98);
    wasm::Err::~Err(&local_98);
  }
  t.val.super__Variant_base<wasm::Table_*,_wasm::Err>.
  super__Move_assign_alias<wasm::Table_*,_wasm::Err>.
  super__Copy_assign_alias<wasm::Table_*,_wasm::Err>.
  super__Move_ctor_alias<wasm::Table_*,_wasm::Err>.super__Copy_ctor_alias<wasm::Table_*,_wasm::Err>.
  super__Variant_storage_alias<wasm::Table_*,_wasm::Err>._37_3_ = 0;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
  if (t.val.super__Variant_base<wasm::Table_*,_wasm::Err>.
      super__Move_assign_alias<wasm::Table_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::Table_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::Table_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Table_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::Table_*,_wasm::Err>._36_4_ == 0) {
    _val_1.val.super__Variant_base<wasm::Table_*,_wasm::Err>.
    super__Move_assign_alias<wasm::Table_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::Table_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::Table_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Table_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::Table_*,_wasm::Err>._32_8_ = type.addressType.id;
    addTableDecl((Result<wasm::Table_*> *)local_c8,this,pos,name,
                 (ImportNames *)
                 _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_,type);
    Result<wasm::Table_*>::Result((Result<wasm::Table_*> *)&err_1,(Result<wasm::Table_*> *)local_c8)
    ;
    pEVar1 = Result<wasm::Table_*>::getErr((Result<wasm::Table_*> *)&err_1);
    if (pEVar1 != (Err *)0x0) {
      wasm::Err::Err((Err *)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_index,pEVar1);
      Result<wasm::Ok>::Result
                (__return_storage_ptr__,
                 (Err *)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_index);
      wasm::Err::~Err((Err *)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_index);
    }
    t.val.super__Variant_base<wasm::Table_*,_wasm::Err>.
    super__Move_assign_alias<wasm::Table_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::Table_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::Table_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Table_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::Table_*,_wasm::Err>._37_3_ = 0;
    t.val.super__Variant_base<wasm::Table_*,_wasm::Err>.
    super__Move_assign_alias<wasm::Table_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::Table_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::Table_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Table_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::Table_*,_wasm::Err>._36_1_ = pEVar1 != (Err *)0x0;
    Result<wasm::Table_*>::~Result((Result<wasm::Table_*> *)&err_1);
    if (t.val.super__Variant_base<wasm::Table_*,_wasm::Err>.
        super__Move_assign_alias<wasm::Table_*,_wasm::Err>.
        super__Copy_assign_alias<wasm::Table_*,_wasm::Err>.
        super__Move_ctor_alias<wasm::Table_*,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Table_*,_wasm::Err>.
        super__Variant_storage_alias<wasm::Table_*,_wasm::Err>._36_4_ == 0) {
      wasm = this->wasm;
      ppTVar2 = Result<wasm::Table_*>::operator*((Result<wasm::Table_*> *)local_c8);
      anon_unknown_5::addExports
                ((Result<wasm::Ok> *)&err_2,&this->in,wasm,(Named *)*ppTVar2,exports,Table);
      local_178 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_2);
      bVar4 = local_178 != (Err *)0x0;
      if (bVar4) {
        wasm::Err::Err(&local_198,local_178);
        Result<wasm::Ok>::Result(__return_storage_ptr__,&local_198);
        wasm::Err::~Err(&local_198);
      }
      t.val.super__Variant_base<wasm::Table_*,_wasm::Err>.
      super__Move_assign_alias<wasm::Table_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::Table_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::Table_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Table_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::Table_*,_wasm::Err>._37_3_ = 0;
      t.val.super__Variant_base<wasm::Table_*,_wasm::Err>.
      super__Move_assign_alias<wasm::Table_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::Table_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::Table_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Table_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::Table_*,_wasm::Err>._36_1_ = bVar4;
      Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_2);
      if (t.val.super__Variant_base<wasm::Table_*,_wasm::Err>.
          super__Move_assign_alias<wasm::Table_*,_wasm::Err>.
          super__Copy_assign_alias<wasm::Table_*,_wasm::Err>.
          super__Move_ctor_alias<wasm::Table_*,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Table_*,_wasm::Err>.
          super__Variant_storage_alias<wasm::Table_*,_wasm::Err>._36_4_ == 0) {
        local_1c8.pos = pos;
        local_1c8.name.super_IString.str._M_len = name.super_IString.str._M_len;
        local_1c8.name.super_IString.str._M_str = name.super_IString.str._M_str;
        sVar3 = std::vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>::size
                          (&this->tableDefs);
        local_1c8.index = (Index)sVar3;
        local_1c8.annotations.
        super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1c8.annotations.
        super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1c8.annotations.
        super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::
        vector(&local_1c8.annotations);
        std::vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>::push_back
                  (&this->tableDefs,&local_1c8);
        DefPos::~DefPos(&local_1c8);
        Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_1c9);
        t.val.super__Variant_base<wasm::Table_*,_wasm::Err>.
        super__Move_assign_alias<wasm::Table_*,_wasm::Err>.
        super__Copy_assign_alias<wasm::Table_*,_wasm::Err>.
        super__Move_ctor_alias<wasm::Table_*,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Table_*,_wasm::Err>.
        super__Variant_storage_alias<wasm::Table_*,_wasm::Err>._36_4_ = 1;
      }
    }
    Result<wasm::Table_*>::~Result((Result<wasm::Table_*> *)local_c8);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> ParseDeclsCtx::addTable(Name name,
                                 const std::vector<Name>& exports,
                                 ImportNames* import,
                                 TableType type,
                                 Index pos) {
  CHECK_ERR(checkImport(pos, import));
  auto t = addTableDecl(pos, name, import, type);
  CHECK_ERR(t);
  CHECK_ERR(addExports(in, wasm, *t, exports, ExternalKind::Table));
  // TODO: table annotations
  tableDefs.push_back({name, pos, Index(tableDefs.size()), {}});
  return Ok{};
}